

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int32_t __thiscall
aeron::archive::AeronArchive::findLastMatchingRecording
          (AeronArchive *this,int64_t minRecordingId,string *channelFragment,int32_t streamId,
          int32_t sessionId)

{
  int64_t iVar1;
  anon_class_40_5_3d16815b local_70;
  function<bool_(long)> local_48;
  int32_t local_28;
  int32_t local_24;
  int32_t sessionId_local;
  int32_t streamId_local;
  string *channelFragment_local;
  int64_t minRecordingId_local;
  AeronArchive *this_local;
  
  local_70.minRecordingId = (int64_t *)&channelFragment_local;
  local_70.streamId = &local_24;
  local_70.sessionId = &local_28;
  local_70.this = this;
  local_70.channelFragment = channelFragment;
  local_28 = sessionId;
  local_24 = streamId;
  _sessionId_local = channelFragment;
  channelFragment_local = (string *)minRecordingId;
  minRecordingId_local = (int64_t)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::findLastMatchingRecording(long,std::__cxx11::string_const&,int,int)::__0,void>
            ((function<bool(long)> *)&local_48,&local_70);
  iVar1 = callAndPollForResponse(this,&local_48,"find last matching recording");
  std::function<bool_(long)>::~function(&local_48);
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::findLastMatchingRecording(std::int64_t minRecordingId, const std::string& channelFragment,
                                                     std::int32_t streamId, std::int32_t sessionId) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->findLastMatchingRecording(minRecordingId, channelFragment, streamId, sessionId,
                                                                  correlationId, controlSessionId_);
        },
        "find last matching recording");
}